

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

GLuint glcts::bitCount(GLuint input)

{
  undefined4 local_10;
  undefined4 local_c;
  GLuint result;
  GLuint input_local;
  
  local_10 = 0;
  for (local_c = input; local_c != 0; local_c = local_c >> 1) {
    if ((local_c & 1) != 0) {
      local_10 = local_10 + 1;
    }
  }
  return local_10;
}

Assistant:

static GLuint bitCount(GLuint input)
{
	GLuint result = 0;
	while (input)
	{
		if (input & 1)
		{
			result += 1;
		}
		input >>= 1;
	}
	return result;
}